

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::applyOperation<fe::operations::op_blit_colored>
               (op_blit_colored *op,ImageData *src,ImageData *dest)

{
  PixelDISTANCE s_2;
  PixelB8G8R8A8 s_1;
  PixelR8G8B8A8 s_3;
  PixelA8 s;
  PixelDISTANCE local_4;
  PixelB8G8R8A8 local_3;
  PixelR8G8B8A8 local_2;
  PixelA8 local_1;
  
  switch((src->super_fe_image).format) {
  case FE_IMG_A8:
    SwitchSrcDestT<fe::PixelA8,fe::operations::op_blit_colored>(op,&local_1,src,dest);
    break;
  default:
    __assert_fail("!\"unknown format\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/ImageDataOperations.h"
                  ,0x183,
                  "void fe::operations::applyOperation(const Op &, const ImageData &, const ImageData &) [Op = fe::operations::op_blit_colored]"
                 );
  case FE_IMG_R8G8B8A8:
    SwitchSrcDestT<fe::PixelR8G8B8A8,fe::operations::op_blit_colored>(op,&local_2,src,dest);
    break;
  case FE_IMG_B8G8R8A8:
    SwitchSrcDestT<fe::PixelB8G8R8A8,fe::operations::op_blit_colored>(op,&local_3,src,dest);
    break;
  case FE_IMG_DISTANCE:
    SwitchSrcDestT<fe::PixelDISTANCE,fe::operations::op_blit_colored>(op,&local_4,src,dest);
  }
  return;
}

Assistant:

void applyOperation(const Op& op, const ImageData& src, const ImageData& dest)
        {
#define FORMAT_CASE FORMAT_OP2
            ALL_FORMATS_SWITCH(src.format);
#undef FORMAT_CASE
        }